

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O3

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v1
          (TPZDohrSubstruct<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *v1,
          TPZFMatrix<std::complex<float>_> *invKc_rc)

{
  _ComplexT _Var1;
  int iVar2;
  pair<int,_int> *ppVar3;
  uint uVar4;
  complex<float> *__s;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar10;
  undefined8 uVar9;
  float fVar11;
  float fVar12;
  TPZFMatrix<std::complex<float>_> temp;
  TPZFMatrix<std::complex<float>_> temp2;
  float local_168;
  float fStack_164;
  TPZFMatrix<std::complex<float>_> local_150;
  TPZFMatrix<std::complex<float>_> local_c0;
  
  uVar7 = (this->fCoarseIndex).fNElements;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 1;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
  local_150.fElem = (complex<float> *)0x0;
  local_150.fGiven = (complex<float> *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = uVar7;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_150.fWork.fStore = (complex<float> *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (uVar7 != 0) {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 << 3);
    memset(__s,0,uVar7 << 3);
    local_150.fElem = __s;
  }
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0181dee0;
  local_c0.fElem = (complex<float> *)0x0;
  local_c0.fGiven = (complex<float> *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181a968;
  local_c0.fWork.fStore = (complex<float> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (0 < (this->fCoarseIndex).fNElements) {
    lVar5 = 0;
    do {
      lVar6 = (long)(this->fCoarseIndex).fStore[lVar5];
      if (((lVar6 < 0) ||
          ((invKc_rc->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar6)) ||
         ((invKc_rc->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar5) ||
         (local_150.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_150.fElem[lVar5]._M_value = invKc_rc->fElem[lVar6]._M_value;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->fCoarseIndex).fNElements);
  }
  TPZMatrix<std::complex<float>_>::Multiply
            (&(this->fPhiC).super_TPZMatrix<std::complex<float>_>,&local_150,&local_c0,0);
  uVar4 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      ppVar3 = (this->fGlobalEqs).fStore;
      lVar6 = (long)ppVar3[uVar7].first;
      iVar2 = ppVar3[uVar7].second;
      lVar5 = (long)iVar2;
      if (((lVar6 < 0) ||
          (local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fRow <= lVar6)) ||
         (local_c0.super_TPZMatrix<std::complex<float>_>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      _Var1 = (this->fWeights).super_TPZVec<std::complex<float>_>.fStore[lVar6]._M_value;
      fVar8 = (float)_Var1;
      fVar10 = (float)(_Var1 >> 0x20);
      fVar11 = *(float *)((long)&local_c0.fElem[lVar6]._M_value + 4);
      fVar12 = *(float *)&local_c0.fElem[lVar6]._M_value * fVar8 - fVar10 * fVar11;
      fVar11 = *(float *)&local_c0.fElem[lVar6]._M_value * fVar10 + fVar8 * fVar11;
      uVar9 = CONCAT44(fVar11,fVar12);
      if ((NAN(fVar12)) && (uVar9 = CONCAT44(fVar11,fVar12), NAN(fVar11))) {
        uVar9 = __mulsc3(fVar8,fVar10);
      }
      fStack_164 = (float)((ulong)uVar9 >> 0x20);
      local_168 = (float)uVar9;
      if (((iVar2 < 0) ||
          ((v1->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar5)) ||
         ((v1->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<float>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      _Var1 = v1->fElem[lVar5]._M_value;
      v1->fElem[lVar5]._M_value =
           CONCAT44(fStack_164 + (float)(_Var1 >> 0x20),local_168 + (float)_Var1);
      uVar7 = uVar7 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar7);
  }
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<std::complex<float>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v1(TPZFMatrix<TVar> &v1, TPZFMatrix<TVar> &invKc_rc) {
	int i;
	//  int j;
	TPZFMatrix<TVar> temp(fCoarseIndex.NElements(), 1);
	TPZFMatrix<TVar> temp2;
	//temp = R(ci)*K(c)_inverted*r(c)
	for (i=0;i<fCoarseIndex.NElements();i++) {
		temp(i, 0) = invKc_rc(fCoarseIndex[i],0);
	}
	//temp2 = Phi*temp
	fPhiC.Multiply(temp, temp2, 0);
	//v1 += R(i)_transposta*W(i)*temp2
#ifdef ZERO_INTERNAL_RESIDU
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		temp2(fInternalEqs[i],0) = 0.;
	}
#endif
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		v1(ind.second,0) += fWeights[ind.first]*temp2(ind.first,0);
	}
}